

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall
Logger::writeLog(Logger *this,string *kindOfMessage,string *message,string *location)

{
  long *plVar1;
  ostream *poVar2;
  long *plVar3;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,kindOfMessage,message);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar1[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
    local_80 = (long *)*plVar1;
  }
  local_78 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_80,(ulong)(location->_M_dataplus)._M_p);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
    local_60 = (long *)*plVar1;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->mLastLog,(string *)&local_60);
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this,(this->mLastLog)._M_dataplus._M_p,
                      (this->mLastLog)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Logger::writeLog(const std::string &kindOfMessage, const std::string &message, const std::string &location) {
    mLastLog = kindOfMessage + message + " IN " + location;
    mLogStream << mLastLog << std::endl;
}